

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream_test.c
# Opt level: O1

int main(void)

{
  undefined1 auVar1 [16];
  sbyte sVar2;
  uint8_t uVar3;
  byte bVar4;
  byte *pbVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint i;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint i_1;
  bool bVar16;
  uint8_t buffer [8];
  byte abStack_48 [5];
  byte bStack_43;
  byte bStack_42;
  byte bStack_41;
  undefined4 uStack_40;
  int local_3c;
  ulong local_38;
  
  uVar15 = 0xfffffffffffffff9;
  uVar13 = 0xfffffff1;
  uVar12 = 1;
  iVar11 = 0;
  do {
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    uVar14 = 1L << ((ulong)((int)uVar12 - 1) & 0x3f);
    pbVar5 = buffer;
    uVar8 = uVar12;
    if (7 < uVar12) {
      lVar10 = (uVar15 >> 3) + 1;
      do {
        uVar8 = uVar8 - 8;
        *pbVar5 = (byte)(uVar14 >> (uVar8 & 0x3f));
        pbVar5 = pbVar5 + 1;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    uVar3 = buffer[0];
    if ((uint)uVar8 != 0) {
      bVar6 = (byte)uVar8;
      sVar2 = (bVar6 < 0x21) * (' ' - bVar6);
      *pbVar5 = (char)((uint)((int)uVar14 << sVar2) >> sVar2) << ((ulong)(byte)(8 - bVar6) & 0x3f) |
                (byte)(0xff >> ((uint)uVar8 & 0x1f)) & *pbVar5;
    }
    uVar8 = (ulong)buffer[0];
    if (uVar12 < 9) {
      uVar8 = (ulong)(buffer[0] >> ((ulong)(byte)(8 - (char)uVar12) & 0x3f));
    }
    else {
      uVar9 = uVar12 - 8;
      pbVar5 = buffer + 1;
      if (7 < uVar9) {
        lVar10 = 0;
        do {
          uVar8 = (ulong)*pbVar5 | uVar8 << 8;
          pbVar5 = pbVar5 + 1;
          lVar10 = lVar10 + 8;
        } while ((ulong)(uVar13 & 0xfffffff8) + 8 != lVar10);
        uVar9 = (ulong)(uint)((int)uVar15 - (int)lVar10);
      }
      if ((int)uVar9 != 0) {
        bVar6 = (byte)uVar9;
        sVar2 = (bVar6 < 0x21) * (' ' - bVar6);
        uVar8 = (ulong)(((uint)(*pbVar5 >> ((byte)(8 - bVar6) & 0x1f)) << sVar2) >> sVar2) |
                uVar8 << (uVar9 & 0x3f);
      }
    }
    if (uVar8 != uVar14) {
      printf("simple_test: expected %016lx, got %016lx\n");
      iVar11 = -1;
    }
    if (uVar3 != 0x80) {
      printf("simple_test: expected buffer 80000000000000000000, got %02x%02x%02x%02x%02x%02x%02x%02x\n"
             ,(ulong)(uint)uVar3,(ulong)buffer[1],(ulong)buffer[2],(ulong)buffer[3],(ulong)buffer[4]
             ,(ulong)buffer[5],(ulong)buffer[6],(ulong)buffer[7]);
      iVar11 = -1;
    }
    uVar12 = uVar12 + 1;
    uVar15 = uVar15 + 1;
    uVar13 = uVar13 + 1;
  } while (uVar12 != 0x41);
  if (iVar11 == 0) {
    iVar11 = 0;
  }
  else {
    puts("simple_test: failed!");
  }
  uVar12 = 0;
  auVar1 = vmovdqu8_avx512vl(SUB6416(ZEXT464(0xa56cd8),0));
  buffer[0] = auVar1[0];
  buffer[1] = auVar1[1];
  buffer[2] = auVar1[2];
  buffer[3] = auVar1[3];
  buffer[4] = auVar1[4];
  buffer[5] = auVar1[5];
  buffer[6] = auVar1[6];
  buffer[7] = auVar1[7];
  abStack_48[0] = auVar1[8];
  abStack_48[1] = auVar1[9];
  abStack_48[2] = auVar1[10];
  abStack_48[3] = auVar1[0xb];
  abStack_48[4] = auVar1[0xc];
  bStack_43 = auVar1[0xd];
  bStack_42 = auVar1[0xe];
  bStack_41 = auVar1[0xf];
  bVar6 = buffer[3] & 3 | 0x28;
  buffer[3] = bVar6;
  uVar15 = 0x1d;
  do {
    uVar8 = 0x361b294aL >> (uVar15 & 0x3f);
    bVar16 = (uVar12 & 7) == 0;
    pbVar5 = abStack_48 + (uVar12 >> 3);
    if (!bVar16) {
      *pbVar5 = (byte)(uVar8 << ((byte)uVar12 & 7 ^ 7)) |
                (byte)(0xff7f >> ((byte)uVar12 & 7)) & *pbVar5;
      pbVar5 = abStack_48 + (uVar12 >> 3) + 1;
    }
    if ((uVar12 & 7) == 0) {
      sVar2 = (bVar16 < 0x21U) * (' ' - bVar16);
      *pbVar5 = (char)((uint)((int)uVar8 << sVar2) >> sVar2) << ((ulong)(byte)(8 - bVar16) & 0x3f) |
                (byte)(0xff >> bVar16) & *pbVar5;
    }
    uVar12 = uVar12 + 1;
    uVar15 = uVar15 - 1;
  } while (uVar12 != 0x1e);
  lVar10 = 1;
  uVar12 = (ulong)buffer[0];
  do {
    uVar12 = (ulong)buffer[lVar10] | uVar12 << 8;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  local_38 = (ulong)buffer[0];
  local_3c = iVar11;
  iVar11 = 0;
  if ((uVar12 << 6 | 10) != 0x361b294a) {
    printf("test_30: expected %016lx, got %016lx\n",0x361b294a);
    iVar11 = -1;
  }
  uVar12 = 0x1d;
  uVar15 = 0;
  do {
    bVar4 = (byte)uVar15 & 7;
    bVar7 = 8 - bVar4;
    sVar2 = (bVar7 < 0x21) * (' ' - bVar7);
    if (((uint)(0x361b294aL >> (uVar12 & 0x3f)) & 1) !=
        (((uint)abStack_48[uVar15 >> 3] << sVar2) >> sVar2) >> (bVar4 ^ 7)) {
      printf("test_30: expected2 %016lx, got %016lx\n");
      iVar11 = -1;
    }
    uVar15 = uVar15 + 1;
    bVar16 = uVar12 != 0;
    uVar12 = uVar12 - 1;
  } while (bVar16);
  if ((((bVar6 != 0x28) || ((char)local_38 != -0x28)) || (buffer[1] != 'l')) || (buffer[2] != 0xa5))
  {
    printf("test_30: expected buffer %016lx, got %02x%02x%02x%02x%02x%02x%02x%02x\n",
           0xd86ca52800000000,local_38,(ulong)buffer[1],(ulong)buffer[2],(ulong)bVar6,
           (ulong)buffer[4],(ulong)buffer[5],(ulong)buffer[6],(ulong)buffer[7]);
    iVar11 = -1;
  }
  if (abStack_48[3] != 0x28 ||
      (abStack_48[2] != 0xa5 || (abStack_48[1] != 0x6c || abStack_48[0] != 0xd8))) {
    printf("test_30: expected buffer2 %016lx, got %02x%02x%02x%02x%02x%02x%02x%02x\n",
           0xd86ca52800000000,(ulong)abStack_48[0],(ulong)abStack_48[1],(ulong)abStack_48[2],
           (ulong)abStack_48[3],(ulong)abStack_48[4],(ulong)bStack_43,(ulong)bStack_42,
           (ulong)bStack_41);
    iVar11 = -1;
  }
  if (iVar11 != 0) {
    puts("test_30: failed!");
    local_3c = iVar11;
  }
  auVar1 = vmovdqu8_avx512vl(SUB6416(ZEXT464(0xa56cd8),0));
  buffer[0] = auVar1[0];
  uVar3 = buffer[0];
  buffer[1] = auVar1[1];
  buffer[2] = auVar1[2];
  buffer[3] = '(';
  auVar1 = vmovdqu8_avx512vl(SUB6416(ZEXT464(0x6b4d9e),0));
  buffer[4] = auVar1[0];
  buffer[5] = auVar1[1];
  buffer[6] = auVar1[2];
  buffer[7] = auVar1[3];
  abStack_48[0] = auVar1[4];
  abStack_48[1] = auVar1[5];
  abStack_48[2] = auVar1[6];
  abStack_48[3] = auVar1[7];
  abStack_48[4] = auVar1[8];
  bStack_43 = auVar1[9];
  bStack_42 = auVar1[10];
  bStack_41 = auVar1[0xb];
  uStack_40 = auVar1._12_4_;
  buffer[7] = buffer[7] & 0xf | 0x50;
  uVar15 = (ulong)buffer[0];
  lVar10 = 1;
  uVar12 = uVar15;
  do {
    uVar12 = (ulong)buffer[lVar10] | uVar12 << 8;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  iVar11 = 0;
  if ((uVar12 << 6 | 10) != 0x361b294a) {
    printf("test_multiple_30: expected %016lx, got %016lx\n",0x361b294a);
    iVar11 = -1;
  }
  uVar12 = 0;
  lVar10 = 4;
  do {
    uVar12 = (ulong)buffer[lVar10] | uVar12 << 8;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 7);
  uVar8 = (ulong)buffer[7];
  if (((ulong)(buffer[7] >> 4) | uVar12 << 4) != 0x9e4d6b5) {
    printf("test_multiple_30: expected %016lx, got %016lx\n",0x9e4d6b5);
    iVar11 = -1;
  }
  if (((uVar3 != 0xd8) || (buffer[1] != 'l')) || (buffer[2] != 0xa5)) {
    printf("test_30: expected buffer %016lx, got %02x%02x%02x%02x%02x%02x%02x%02x\n",
           0xd86ca52800000000,uVar15,(ulong)buffer[1],(ulong)buffer[2],0x28,(ulong)buffer[4],
           (ulong)buffer[5],(ulong)buffer[6],uVar8);
    iVar11 = -1;
  }
  if (iVar11 != 0) {
    puts("test_multiple_30: failed!");
    local_3c = iVar11;
  }
  return local_3c;
}

Assistant:

int main(void) {
  int ret = 0;

  int tmp = simple_test();
  if (tmp) {
    printf("simple_test: failed!\n");
    ret = tmp;
  }

  tmp = test_30();
  if (tmp) {
    printf("test_30: failed!\n");
    ret = tmp;
  }

  tmp = test_multiple_30();
  if (tmp) {
    printf("test_multiple_30: failed!\n");
    ret = tmp;
  }

  return ret;
}